

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

void __thiscall ValueHashTable<Sym_*,_Value_*>::Clear(ValueHashTable<Sym_*,_Value_*> *this,uint key)

{
  uint uVar1;
  DictionaryStats *this_00;
  bool bVar2;
  bool bVar3;
  Type *pTVar4;
  undefined1 local_40 [8];
  EditingIterator iter;
  
  local_40 = (undefined1  [8])(this->table + (ulong)key % (ulong)this->tableSize);
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list =
       (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)local_40;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
            EditingIterator::Next((EditingIterator *)local_40);
    if (!bVar3) {
      return;
    }
    pTVar4 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    uVar1 = pTVar4->value->m_id;
    bVar3 = false;
  } while (key < uVar1);
  if (uVar1 == key) {
    SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::EditingIterator::
    RemoveCurrent((EditingIterator *)local_40,&this->alloc->super_ArenaAllocator);
    this_00 = this->stats;
    if (this_00 != (DictionaryStats *)0x0) {
      if (bVar2) {
        bVar3 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::
                EditingIterator::Next((EditingIterator *)local_40);
        bVar3 = !bVar3;
      }
      else {
        bVar3 = false;
      }
      DictionaryStats::Remove(this_00,bVar3);
    }
  }
  return;
}

Assistant:

void Clear(uint key)
    {
        uint hash = this->Hash(key);
        SListBase<HashBucket> * list = &this->table[hash];

        // Assumes sorted lists
#if PROFILE_DICTIONARY
        bool first = true;
#endif
        FOREACH_SLISTBASE_ENTRY_EDITING(HashBucket, bucket, list, iter)
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    iter.RemoveCurrent(this->alloc);
#if PROFILE_DICTIONARY
                    if (stats)
                        stats->Remove(first && !(iter.Next()));
#endif
                }
                return;
            }
#if PROFILE_DICTIONARY
        first = false;
#endif
        } NEXT_SLISTBASE_ENTRY_EDITING;
    }